

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O2

bool __thiscall Disa::Matrix_Sparse::contains(Matrix_Sparse *this,size_t *i_row,size_t *i_column)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator_element iter_element;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_68;
  const_iterator_element local_58;
  iterator local_38;
  
  find(&local_58,this,i_row,i_column);
  if (local_58.row_index == *i_row) {
    cVar2 = begin(this);
    local_68.matrix = cVar2.matrix_row.matrix;
    local_68.row_index = cVar2.matrix_row.row_index + *i_row;
    Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end(&local_38,&local_68);
    bVar1 = Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::operator!=
                      (&local_58,&local_38);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Matrix_Sparse::contains(const std::size_t& i_row, const std::size_t& i_column) const {
  const auto iter_element = find(i_row, i_column);
  return iter_element.i_row() == i_row && iter_element != (*(begin() + static_cast<s_size_t>(i_row))).end();
}